

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.h
# Opt level: O1

void __thiscall
btQuantizedBvh::mergeInternalNodeAabb
          (btQuantizedBvh *this,int nodeIndex,btVector3 *newAabbMin,btVector3 *newAabbMax)

{
  btScalar *pbVar1;
  btOptimizedBvhNode *pbVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  ushort uVar6;
  btQuantizedBvhNode *pbVar7;
  btOptimizedBvhNode *pbVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  uint local_10;
  ushort local_c;
  uint local_8;
  ushort local_4;
  
  if (this->m_useQuantization == true) {
    fVar3 = (this->m_bvhAabbMin).m_floats[2];
    fVar4 = (this->m_bvhQuantization).m_floats[2];
    uVar5 = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
    fVar12 = (float)uVar5;
    fVar13 = (float)((ulong)uVar5 >> 0x20);
    uVar5 = *(undefined8 *)(this->m_bvhQuantization).m_floats;
    fVar14 = (float)uVar5;
    fVar15 = (float)((ulong)uVar5 >> 0x20);
    auVar10._0_4_ = (int)(((float)*(undefined8 *)newAabbMin->m_floats - fVar12) * fVar14);
    auVar10._4_4_ =
         (int)(((float)((ulong)*(undefined8 *)newAabbMin->m_floats >> 0x20) - fVar13) * fVar15);
    auVar10._8_8_ = 0;
    auVar11 = pshuflw(auVar10,auVar10,0xe8);
    local_8 = auVar11._0_4_ & (uint)DAT_001f5d70;
    local_4 = (ushort)(int)((newAabbMin->m_floats[2] - fVar3) * fVar4) & 0xfffe;
    auVar11._0_4_ = (int)(((float)*(undefined8 *)newAabbMax->m_floats - fVar12) * fVar14 + 1.0);
    auVar11._4_4_ =
         (int)(((float)((ulong)*(undefined8 *)newAabbMax->m_floats >> 0x20) - fVar13) * fVar15 + 1.0
              );
    auVar11._8_8_ = 0;
    auVar11 = pshuflw(auVar11,auVar11,0xe8);
    local_10 = auVar11._0_4_ | (uint)DAT_001f59d0;
    local_c = (ushort)(int)((newAabbMax->m_floats[2] - fVar3) * fVar4 + 1.0) | 1;
    pbVar7 = (this->m_quantizedContiguousNodes).m_data;
    lVar9 = 0;
    do {
      uVar6 = *(ushort *)((long)&local_8 + lVar9 * 2);
      if (uVar6 < pbVar7[nodeIndex].m_quantizedAabbMin[lVar9]) {
        pbVar7[nodeIndex].m_quantizedAabbMin[lVar9] = uVar6;
      }
      uVar6 = *(ushort *)((long)&local_10 + lVar9 * 2);
      if (pbVar7[nodeIndex].m_quantizedAabbMax[lVar9] < uVar6) {
        pbVar7[nodeIndex].m_quantizedAabbMax[lVar9] = uVar6;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
  }
  else {
    pbVar8 = (this->m_contiguousNodes).m_data;
    pbVar2 = pbVar8 + nodeIndex;
    if (newAabbMin->m_floats[0] < pbVar8[nodeIndex].m_aabbMinOrg.m_floats[0]) {
      (pbVar2->m_aabbMinOrg).m_floats[0] = newAabbMin->m_floats[0];
    }
    if (newAabbMin->m_floats[1] < (pbVar2->m_aabbMinOrg).m_floats[1]) {
      (pbVar2->m_aabbMinOrg).m_floats[1] = newAabbMin->m_floats[1];
    }
    if (newAabbMin->m_floats[2] < (pbVar2->m_aabbMinOrg).m_floats[2]) {
      (pbVar2->m_aabbMinOrg).m_floats[2] = newAabbMin->m_floats[2];
    }
    if (newAabbMin->m_floats[3] < (pbVar2->m_aabbMinOrg).m_floats[3]) {
      (pbVar2->m_aabbMinOrg).m_floats[3] = newAabbMin->m_floats[3];
    }
    fVar3 = newAabbMax->m_floats[0];
    if ((pbVar2->m_aabbMaxOrg).m_floats[0] <= fVar3 && fVar3 != (pbVar2->m_aabbMaxOrg).m_floats[0])
    {
      (pbVar2->m_aabbMaxOrg).m_floats[0] = fVar3;
    }
    fVar3 = newAabbMax->m_floats[1];
    pbVar1 = (pbVar2->m_aabbMaxOrg).m_floats + 1;
    if (*pbVar1 <= fVar3 && fVar3 != *pbVar1) {
      (pbVar2->m_aabbMaxOrg).m_floats[1] = fVar3;
    }
    fVar3 = newAabbMax->m_floats[2];
    pbVar1 = (pbVar2->m_aabbMaxOrg).m_floats + 2;
    if (*pbVar1 <= fVar3 && fVar3 != *pbVar1) {
      (pbVar2->m_aabbMaxOrg).m_floats[2] = fVar3;
    }
    fVar3 = newAabbMax->m_floats[3];
    pbVar1 = (pbVar2->m_aabbMaxOrg).m_floats + 3;
    if (*pbVar1 <= fVar3 && fVar3 != *pbVar1) {
      (pbVar2->m_aabbMaxOrg).m_floats[3] = fVar3;
      return;
    }
  }
  return;
}

Assistant:

void mergeInternalNodeAabb(int nodeIndex,const btVector3& newAabbMin,const btVector3& newAabbMax) 
	{
		if (m_useQuantization)
		{
			unsigned short int quantizedAabbMin[3];
			unsigned short int quantizedAabbMax[3];
			quantize(quantizedAabbMin,newAabbMin,0);
			quantize(quantizedAabbMax,newAabbMax,1);
			for (int i=0;i<3;i++)
			{
				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] > quantizedAabbMin[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] = quantizedAabbMin[i];

				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] < quantizedAabbMax[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] = quantizedAabbMax[i];

			}
		} else
		{
			//non-quantized
			m_contiguousNodes[nodeIndex].m_aabbMinOrg.setMin(newAabbMin);
			m_contiguousNodes[nodeIndex].m_aabbMaxOrg.setMax(newAabbMax);		
		}
	}